

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TestGroupStats::TestGroupStats
          (TestGroupStats *this,GroupInfo *_groupInfo,Totals *_totals,bool _aborting)

{
  bool _aborting_local;
  Totals *_totals_local;
  GroupInfo *_groupInfo_local;
  TestGroupStats *this_local;
  
  GroupInfo::GroupInfo(&this->groupInfo,_groupInfo);
  memcpy(&this->totals,_totals,0x38);
  this->aborting = _aborting;
  return;
}

Assistant:

TestGroupStats::TestGroupStats(GroupInfo const &_groupInfo,
        Totals const &_totals,
        bool _aborting)
        : groupInfo(_groupInfo),
        totals(_totals),
        aborting(_aborting)
    {}